

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Rget(void *origin_addr,int origin_count,MPIABI_Datatype origin_datatype,int target_rank,
               MPIABI_Aint target_disp,int target_count,MPIABI_Datatype target_datatype,
               MPIABI_Win win,MPIABI_Request *request)

{
  MPIABI_Aint MVar1;
  int iVar2;
  int iVar3;
  ompi_datatype_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_win_t *poVar6;
  ompi_request_t **ppoVar7;
  WPI_HandlePtr<ompi_request_t_*> local_60;
  WPI_Handle local_58 [8];
  WPI_Handle local_50 [8];
  WPI_Handle local_48 [12];
  int local_3c;
  MPIABI_Aint MStack_38;
  int target_count_local;
  MPIABI_Aint target_disp_local;
  MPIABI_Datatype MStack_28;
  int target_rank_local;
  MPIABI_Datatype origin_datatype_local;
  void *pvStack_18;
  int origin_count_local;
  void *origin_addr_local;
  
  local_3c = target_count;
  MStack_38 = target_disp;
  target_disp_local._4_4_ = target_rank;
  MStack_28 = origin_datatype;
  origin_datatype_local._4_4_ = origin_count;
  pvStack_18 = origin_addr;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_48,origin_datatype);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_48);
  iVar2 = target_disp_local._4_4_;
  MVar1 = MStack_38;
  iVar3 = local_3c;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_50,target_datatype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_50);
  WPI_Handle<ompi_win_t_*>::WPI_Handle((WPI_Handle<ompi_win_t_*> *)local_58,win);
  poVar6 = WPI_Handle::operator_cast_to_ompi_win_t_(local_58);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_60,request);
  ppoVar7 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_60);
  iVar3 = MPI_Rget(origin_addr,origin_count,poVar4,iVar2,MVar1,iVar3,poVar5,poVar6,ppoVar7);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_60);
  return iVar3;
}

Assistant:

int MPIABI_Rget(
  void * origin_addr,
  int origin_count,
  MPIABI_Datatype origin_datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  int target_count,
  MPIABI_Datatype target_datatype,
  MPIABI_Win win,
  MPIABI_Request * request
) {
  return MPI_Rget(
    origin_addr,
    origin_count,
    (MPI_Datatype)(WPI_Datatype)origin_datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    target_count,
    (MPI_Datatype)(WPI_Datatype)target_datatype,
    (MPI_Win)(WPI_Win)win,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}